

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

bool __thiscall
capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage::tryExpandUsage
          (DataLocationUsage *this,Group *group,DataLocation *location,uint desiredUsage,
          bool newHoles)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  Fault f;
  Fault local_20;
  
  if ((desiredUsage <= location->lgSize) ||
     (bVar1 = Union::DataLocation::tryExpandTo(location,group->parent,desiredUsage), bVar1)) {
    if (newHoles) {
      uVar2 = (ulong)this->lgSizeUsed;
      if (this->lgSizeUsed < (byte)desiredUsage) {
        do {
          (this->holes).holes[uVar2] = '\x01';
          uVar2 = uVar2 + 1;
        } while (uVar2 < (desiredUsage & 7));
      }
    }
    else {
      pcVar3 = getenv("CAPNP_IGNORE_ISSUE_344");
      if (pcVar3 == (char *)0x0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[177]>
                  (&local_20,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                   ,0x1b4,FAILED,(char *)0x0,
                   "\"Bad news: Cap\'n Proto 0.5.x and previous contained a bug which would cause this schema to be compiled incorrectly. Please see: https://github.com/capnproto/capnproto/issues/344\""
                   ,(char (*) [177])
                    "Bad news: Cap\'n Proto 0.5.x and previous contained a bug which would cause this schema to be compiled incorrectly. Please see: https://github.com/capnproto/capnproto/issues/344"
                  );
        kj::_::Debug::Fault::fatal(&local_20);
      }
    }
    this->lgSizeUsed = (byte)desiredUsage;
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool tryExpandUsage(Group& group, Union::DataLocation& location, uint desiredUsage,
                          bool newHoles) {
        if (desiredUsage > location.lgSize) {
          // Need to expand the underlying slot.
          if (!location.tryExpandTo(group.parent, desiredUsage)) {
            return false;
          }
        }

        // Underlying slot is big enough, so expand our size and update holes.
        if (newHoles) {
          holes.addHolesAtEnd(lgSizeUsed, 1, desiredUsage);
        } else if (shouldDetectIssue344()) {
          // Unfortunately, Cap'n Proto 0.5.x and below would always call addHolesAtEnd(), which
          // was the wrong thing to do when called from tryExpand(), which itself is only called
          // in cases involving unions nested in other unions. The bug could lead to multiple
          // fields in a group incorrectly being assigned overlapping offsets. Although the bug
          // is now fixed by adding the `newHoles` parameter, this silently breaks
          // backwards-compatibility with affected schemas. Therefore, for now, we throw an
          // exception to alert developers of the problem.
          //
          // TODO(cleanup): Once sufficient time has elapsed, remove this assert.
          KJ_FAIL_ASSERT("Bad news: Cap'n Proto 0.5.x and previous contained a bug which would cause this schema to be compiled incorrectly. Please see: https://github.com/capnproto/capnproto/issues/344");
        }
        lgSizeUsed = desiredUsage;
        return true;
      }